

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_wrapper.h
# Opt level: O3

bool date::
     read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,short,2u,2u,true,date::character_t<char>&,date::unsigned_integer_t<short,2u,2u>&>
               (iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos,
               iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end,
               signed_integer_t<short,_2U,_2U,_true> *fmt,character_t<char> *others,
               unsigned_integer_t<short,_2U,_2U> *others_1)

{
  char cVar1;
  short sVar2;
  bool bVar3;
  short x;
  unsigned_integer_t<short,_2U,_2U> unsignedFmt;
  value_type_conflict local_3a;
  unsigned_integer_t<short,_2U,_2U> local_38;
  
  if (end->m_position == pos->m_position) {
    return false;
  }
  cVar1 = pos->m_cache[pos->m_position];
  if ((cVar1 == '-') || (cVar1 == '+')) {
    iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator++(pos);
    local_38.value = &local_3a;
    local_3a = 0;
    bVar3 = read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,short,2u,2u>
                      (pos,end,&local_38);
    if (bVar3) {
      sVar2 = -local_3a;
      if (cVar1 != '-') {
        sVar2 = local_3a;
      }
      *fmt->value = sVar2;
      bVar3 = read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,char,date::unsigned_integer_t<short,2u,2u>&>
                        (pos,end,others,others_1);
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool operator==(const iterator_proxy& rhs) const 
    {
        return (rhs.m_position == m_position);
    }